

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O2

int Ssc_GiaResimulateOneClass(Ssc_Man_t *p,int iRepr,int iObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar3;
  
  pGVar3 = p->pAig;
  if (((uint)pGVar3->pReprs[iObj] & 0xfffffff) != iRepr) {
    __assert_fail("iRepr == Gia_ObjRepr(p->pAig, iObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,199,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  iVar1 = Gia_ObjIsHead(pGVar3,iRepr);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsHead( p->pAig, iRepr )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,200,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  Gia_ManIncrementTravId(pGVar3);
  pGVar3 = p->pAig;
  iVar2 = Gia_ObjIsHead(pGVar3,iRepr);
  iVar1 = iRepr;
  if (iVar2 == 0) {
    __assert_fail("Gia_ObjIsHead(p->pAig, iRepr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0xcb,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  for (; iVar1 != 0; iVar1 = pGVar3->pNexts[iVar1]) {
    pObj = Gia_ManObj(pGVar3,iVar1);
    Ssc_GiaSimulatePattern_rec(p,pObj);
    pGVar3 = p->pAig;
  }
  iVar1 = Ssc_GiaSimClassRefineOneBit(pGVar3,iRepr);
  if (((uint)p->pAig->pReprs[iObj] & 0xfffffff) == iRepr) {
    __assert_fail("iRepr != Gia_ObjRepr(p->pAig, iObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0xd0,"int Ssc_GiaResimulateOneClass(Ssc_Man_t *, int, int)");
  }
  return iVar1;
}

Assistant:

int Ssc_GiaResimulateOneClass( Ssc_Man_t * p, int iRepr, int iObj )
{
    int Ent, RetValue;
    assert( iRepr == Gia_ObjRepr(p->pAig, iObj) );
    assert( Gia_ObjIsHead( p->pAig, iRepr ) );
    // set bit-values at the nodes according to the counter-example
    Gia_ManIncrementTravId( p->pAig );
    Gia_ClassForEachObj( p->pAig, iRepr, Ent )
        Ssc_GiaSimulatePattern_rec( p, Gia_ManObj(p->pAig, Ent) );
    // refine one class using these bit-values
    RetValue = Ssc_GiaSimClassRefineOneBit( p->pAig, iRepr );
    // check that the candidate equivalence is indeed refined
    assert( iRepr != Gia_ObjRepr(p->pAig, iObj) );
    return RetValue;
}